

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

char16_t * QtPrivate::qustrcasechr(QStringView str,char16_t c)

{
  const_iterator pvVar1;
  QChar *pQVar2;
  long in_FS_OFFSET;
  QChar *it;
  QChar *e;
  QChar *n;
  QStringView *this;
  QChar *in_stack_ffffffffffffffc8;
  anon_class_2_1_54a39803_for__M_pred __pred;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_18;
  pvVar1 = QStringView::begin((QStringView *)0x503db7);
  __pred.c = (char16_t)((ulong)pvVar1 >> 0x30);
  pvVar1 = QStringView::end(this);
  foldCase(L'\0');
  pQVar2 = std::find_if<QChar_const*,QtPrivate::qustrcasechr(QStringView,char16_t)::__0>
                     (pvVar1,in_stack_ffffffffffffffc8,__pred);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return &pQVar2->ucs;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
const char16_t *QtPrivate::qustrcasechr(QStringView str, char16_t c) noexcept
{
    const QChar *n = str.begin();
    const QChar *e = str.end();
    c = foldCase(c);
    auto it = std::find_if(n, e, [c](auto ch) { return foldAndCompare(ch, QChar(c)); });
    return reinterpret_cast<const char16_t *>(it);
}